

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O3

ion_err_t flat_file_destroy(ion_flat_file_t *flat_file)

{
  ion_err_t iVar1;
  int iVar2;
  char filename [12];
  char local_1c [12];
  
  free(flat_file->buffer);
  flat_file->buffer = (ion_byte_t *)0x0;
  iVar2 = fclose((FILE *)flat_file->data_file);
  iVar1 = '\n';
  if (iVar2 == 0) {
    dictionary_get_filename((flat_file->super).id,"ffs",local_1c);
    iVar2 = remove(local_1c);
    iVar1 = '\v';
    if (iVar2 == 0) {
      flat_file->data_file = (FILE *)0x0;
      iVar1 = '\0';
    }
  }
  return iVar1;
}

Assistant:

ion_err_t
flat_file_destroy(
	ion_flat_file_t *flat_file
) {
	ion_err_t err = flat_file_close(flat_file);

	if (err_ok != err) {
		return err;
	}

	char filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(flat_file->super.id, "ffs", filename);

	if (0 != fremove(filename)) {
		return err_file_delete_error;
	}

	flat_file->data_file = NULL;

	return err_ok;
}